

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall
chip8::interpreter::interpreter
          (interpreter *this,path *rom_path,window *interpreter_window,beeper *beeper,
          nanoseconds tick_period)

{
  registers *prVar1;
  size_t __n;
  _Bind<void_(sdl::beeper::*(sdl::beeper_*))()_noexcept> local_60;
  _Bind<void_(sdl::beeper::*(sdl::beeper_*))()_noexcept> local_48;
  
  this->m_is_running = true;
  this->m_interpreter_window = interpreter_window;
  display::display(&this->m_display,interpreter_window,0x40,0x20);
  (this->m_machine_tick_period).__r = tick_period.__r;
  (this->m_timers).super__Vector_base<chip8::timer,_std::allocator<chip8::timer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_timers).super__Vector_base<chip8::timer,_std::allocator<chip8::timer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_timers).super__Vector_base<chip8::timer,_std::allocator<chip8::timer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_registers).i = 0;
  (this->m_registers).pc = 0x200;
  (this->m_registers).sp = -1;
  (this->m_registers).delay = '\0';
  (this->m_registers).sound = '\0';
  (this->m_registers).v._M_elems[0] = 0;
  (this->m_registers).v._M_elems[1] = 0;
  (this->m_registers).v._M_elems[2] = 0;
  (this->m_registers).v._M_elems[3] = 0;
  (this->m_registers).v._M_elems[4] = 0;
  (this->m_registers).v._M_elems[5] = 0;
  (this->m_registers).v._M_elems[6] = 0;
  (this->m_registers).v._M_elems[7] = 0;
  prVar1 = &this->m_registers;
  (prVar1->v)._M_elems[8] = 0;
  (prVar1->v)._M_elems[9] = 0;
  (prVar1->v)._M_elems[10] = 0;
  (prVar1->v)._M_elems[0xb] = 0;
  (prVar1->v)._M_elems[0xc] = 0;
  (prVar1->v)._M_elems[0xd] = 0;
  (prVar1->v)._M_elems[0xe] = 0;
  (prVar1->v)._M_elems[0xf] = 0;
  __n = display::get_pixel_count(&this->m_display);
  local_48._M_f = local_48._M_f & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->m_video_mem,__n,(bool *)&local_48,(allocator_type *)&local_60);
  std::vector<chip8::timer,std::allocator<chip8::timer>>::
  emplace_back<unsigned_char&,std::chrono::duration<long,std::ratio<1l,1000000000l>>const&>
            ((vector<chip8::timer,std::allocator<chip8::timer>> *)&this->m_timers,
             &(this->m_registers).delay,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&constants::timer_tick_freq);
  local_48._M_f = (offset_in_beeper_to_subr)sdl::beeper::play;
  local_48._8_8_ = 0;
  local_60._M_f = (offset_in_beeper_to_subr)sdl::beeper::pause;
  local_60._8_8_ = 0;
  local_60._M_bound_args.super__Tuple_impl<0UL,_sdl::beeper_*>.
  super__Head_base<0UL,_sdl::beeper_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sdl::beeper_*>)(_Tuple_impl<0UL,_sdl::beeper_*>)beeper;
  local_48._M_bound_args.super__Tuple_impl<0UL,_sdl::beeper_*>.
  super__Head_base<0UL,_sdl::beeper_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sdl::beeper_*>)(_Tuple_impl<0UL,_sdl::beeper_*>)beeper;
  std::vector<chip8::timer,std::allocator<chip8::timer>>::
  emplace_back<unsigned_char&,std::chrono::duration<long,std::ratio<1l,1000000000l>>const&,std::_Bind<void(sdl::beeper::*(sdl::beeper*))()noexcept>,std::_Bind<void(sdl::beeper::*(sdl::beeper*))()noexcept>>
            ((vector<chip8::timer,std::allocator<chip8::timer>> *)&this->m_timers,
             &(this->m_registers).sound,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&constants::timer_tick_freq,&local_48,
             &local_60);
  memcpy(&this->m_mem,font::raw_data,0x50);
  load_rom_from_file(rom_path,&this->m_mem);
  return;
}

Assistant:

interpreter::interpreter(const std::filesystem::path& rom_path, sdl::window& interpreter_window, sdl::beeper& beeper,
	std::chrono::nanoseconds tick_period) :
		m_is_running{true},
		m_interpreter_window{interpreter_window},
		m_display{m_interpreter_window, constants::ch8_width, constants::ch8_height},
		m_machine_tick_period{tick_period},
		m_registers{constants::code_start},
		m_video_mem(this->m_display.get_pixel_count())
{
	// Set up timers
	// Timer index 0 - delay
	// Timer index 1 - sound
	this->m_timers.emplace_back(this->m_registers.delay, constants::timer_tick_freq);
	this->m_timers.emplace_back(this->m_registers.sound, constants::timer_tick_freq,
		std::bind(&sdl::beeper::play, &beeper),
		std::bind(&sdl::beeper::pause, &beeper)
	);

	// Set up memory
	std::copy_n(chip8::font::raw_data.begin(), chip8::font::raw_data.size(), this->m_mem.begin());
	chip8::load_rom_from_file(rom_path, this->m_mem);
}